

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_element_segment_info(element_segment sec)

{
  uint uVar1;
  element_pointer paVar2;
  uint local_2c;
  uint local_28;
  int j;
  int i;
  uint32 offset;
  element_pointer ep;
  element_segment sec_local;
  
  paVar2 = sec.element_segment_addr;
  for (local_28 = 0; local_28 < sec.element_segment_count; local_28 = local_28 + 1) {
    uVar1 = *paVar2[(int)local_28].offset.arg;
    printf("  - element[%d] table=0 offset=%d count=%d\n",(ulong)local_28,(ulong)uVar1,
           (ulong)paVar2[(int)local_28].init_data_count);
    for (local_2c = 0; local_2c < paVar2[(int)local_28].init_data_count; local_2c = local_2c + 1) {
      printf("   - ele[%d] =func[%d]\n",(ulong)(local_2c + uVar1),
             (ulong)paVar2[(int)local_28].init_data[(int)local_2c]);
    }
  }
  return;
}

Assistant:

void print_element_segment_info(element_segment sec) {
    element_pointer ep;
    uint32 offset;
    for (int i = 0; i < sec.element_segment_count; ++i) {
        ep = sec.element_segment_addr + i;
        offset = *(uint32 *) (ep->offset.arg);
        printf("  - element[%d] table=0 offset=%d count=%d\n", i, offset, ep->init_data_count);
        for (int j = 0; j < ep->init_data_count; ++j) {
            printf("   - ele[%d] =func[%d]\n", j + offset, *(uint32 *) (ep->init_data + j));
        }
    }
}